

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O3

void * TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::
       GlobalAssemble(void *t)

{
  TPZCompEl *el;
  TPZGuiInterface *this;
  bool bVar1;
  TPZCompEl **ppTVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  TPZElementMatrix *pTVar6;
  long lVar7;
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *pTVar8;
  TPZChunkVector<TPZCompEl_*,_10> *this_00;
  long lVar9;
  TPZElementMatrix *efb;
  TPZElementMatrix *ekb;
  int iVar10;
  ostream *poVar11;
  unique_lock<std::mutex> global_lock;
  unique_lock<std::mutex> local_70;
  TPZChunkVector<TPZCompEl_*,_10> *local_60;
  long local_58;
  TPZStack<TPZElementMatrix_*,_10> *local_50;
  TPZStack<TPZElementMatrix_*,_10> *local_48;
  TPZStack<long,_10> *local_40;
  TPZElementMatrix *local_38;
  
  lVar7 = *(long *)((long)t + 0xe0);
  lVar9 = *(long *)((long)t + 0xe8);
  if (lVar7 < lVar9) {
    this_00 = (TPZChunkVector<TPZCompEl_*,_10> *)(*(long *)((long)t + 8) + 0x40);
    local_58 = (long)t + 0x20;
    local_40 = (TPZStack<long,_10> *)((long)t + 0x108);
    local_50 = (TPZStack<TPZElementMatrix_*,_10> *)((long)t + 0x1e8);
    local_48 = (TPZStack<TPZElementMatrix_*,_10> *)((long)t + 0x178);
    local_60 = this_00;
    do {
      iVar10 = (int)(SUB168(SEXT816(lVar9) * ZEXT816(0xa3d70a3d70a3d70b),8) >> 7) -
               (SUB164(SEXT816(lVar9) * ZEXT816(0xa3d70a3d70a3d70b),0xc) >> 0x1f);
      if (lVar9 + 199U < 399) {
        iVar10 = 1;
      }
      if (lVar7 % (long)iVar10 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"*",1);
      }
      std::ostream::flush();
      if ((*(long *)((long)t + 0xe0) != 0) &&
         (*(long *)((long)t + 0xe0) % (long)(iVar10 * 0x14) == 0)) {
        if (*(long *)((long)t + 0xd8) == *(long *)((long)t + 0xe8)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          poVar11 = (ostream *)&std::cout;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Element ",9);
          poVar11 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          poVar11 = std::ostream::_M_insert<long>((long)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"% Elements computed ",0x14);
        }
        poVar11 = std::ostream::_M_insert<long>((long)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"% Elements assembled ",0x15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        std::ostream::flush();
      }
      lVar7 = *(long *)((long)t + 0xe0);
      *(long *)((long)t + 0xe0) = lVar7 + 1;
      lVar9 = (long)*(int *)(*(long *)((long)t + 0xb0) + lVar7 * 4);
      if (-1 < lVar9) {
        ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[](this_00,lVar9);
        el = *ppTVar2;
        if (el != (TPZCompEl *)0x0) {
          plVar3 = (long *)(**(code **)(*(long *)el + 0xb8))(el);
          if (plVar3 == (long *)0x0) {
            lVar9 = __dynamic_cast(el,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
            lVar5 = __dynamic_cast(el,&TPZCompEl::typeinfo,&TPZElementGroup::typeinfo,0);
            lVar4 = __dynamic_cast(el,&TPZCompEl::typeinfo,&TPZCondensedCompEl::typeinfo,0);
            if (((lVar9 != 0) || (lVar5 != 0)) || (lVar4 != 0)) goto LAB_01378b73;
          }
          else {
            iVar10 = (**(code **)(*plVar3 + 0x58))(plVar3);
            if (*(int *)((long)t + 0x40) == 0) {
LAB_01378b73:
              local_70._M_device = &mutex_global_assemble;
              local_70._M_owns = false;
              std::unique_lock<std::mutex>::lock(&local_70);
              local_70._M_owns = true;
              if (lVar7 != -1) {
                do {
                  if (0 < *(long *)((long)t + 0x118)) {
                    lVar9 = 0;
                    do {
                      if (*(long *)(*(long *)((long)t + 0x110) + lVar9 * 8) == lVar7) {
                        ekb = *(TPZElementMatrix **)(*(long *)((long)t + 0x180) + lVar9 * 8);
                        efb = *(TPZElementMatrix **)(*(long *)((long)t + 0x1f0) + lVar9 * 8);
                        lVar5 = TPZStack<long,_10>::Pop(local_40);
                        local_38 = TPZStack<TPZElementMatrix_*,_10>::Pop(local_48);
                        pTVar6 = TPZStack<TPZElementMatrix_*,_10>::Pop(local_50);
                        lVar7 = *(long *)((long)t + 0x118);
                        if (lVar7 < *(int *)((long)t + 0xf0)) {
                          std::condition_variable::notify_all();
                          lVar7 = *(long *)((long)t + 0x118);
                        }
                        this_00 = local_60;
                        if (lVar9 < lVar7) {
                          *(long *)(*(long *)((long)t + 0x110) + lVar9 * 8) = lVar5;
                          *(TPZElementMatrix **)(*(long *)((long)t + 0x180) + lVar9 * 8) = local_38;
                          *(TPZElementMatrix **)(*(long *)((long)t + 0x1f0) + lVar9 * 8) = pTVar6;
                        }
                        goto LAB_01378c78;
                      }
                      lVar9 = lVar9 + 1;
                    } while (*(long *)((long)t + 0x118) != lVar9);
                  }
                  std::condition_variable::wait((unique_lock *)condassemble);
                } while( true );
              }
              efb = (TPZElementMatrix *)0x0;
              ekb = (TPZElementMatrix *)0x0;
LAB_01378c78:
              std::unique_lock<std::mutex>::~unique_lock(&local_70);
              TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::
              AssembleElement((TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>
                               *)t,el,ekb,efb,*(TPZMatrix<double> **)((long)t + 0xf8),
                              *(TPZFMatrix<double> **)((long)t + 0x100));
              if (*(long *)((long)t + 0xe0) == *(long *)((long)t + 0xe8)) {
                pTVar8 = (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>
                          *)__dynamic_cast(*(undefined8 *)((long)t + 0xf8),
                                           &TPZMatrix<double>::typeinfo,
                                           &TPZParFrontMatrix<double,TPZFileEqnStorage<double>,TPZFrontSym<double>>
                                            ::typeinfo,0);
                TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::
                FinishWriting(pTVar8);
              }
              (*ekb->_vptr_TPZElementMatrix[1])(ekb);
              (*efb->_vptr_TPZElementMatrix[1])(efb);
              if (((*(undefined8 **)((long)t + 0xd0) != (undefined8 *)0x0) &&
                  (this = (TPZGuiInterface *)**(undefined8 **)((long)t + 0xd0),
                  this != (TPZGuiInterface *)0x0)) &&
                 (bVar1 = TPZGuiInterface::AmIKilled(this), bVar1)) {
                pTVar8 = (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>
                          *)__dynamic_cast(*(undefined8 *)((long)t + 0xf8),
                                           &TPZMatrix<double>::typeinfo,
                                           &TPZParFrontMatrix<double,TPZFileEqnStorage<double>,TPZFrontSym<double>>
                                            ::typeinfo,0);
                TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::
                FinishWriting(pTVar8);
                break;
              }
            }
            else {
              lVar9 = *(long *)((long)t + 0x28);
              lVar5 = local_58;
              if (lVar9 != 0) {
                do {
                  if (iVar10 <= *(int *)(lVar9 + 0x20)) {
                    lVar5 = lVar9;
                  }
                  lVar9 = *(long *)(lVar9 + 0x10 + (ulong)(*(int *)(lVar9 + 0x20) < iVar10) * 8);
                } while (lVar9 != 0);
                if ((lVar5 != local_58) && (*(int *)(lVar5 + 0x20) <= iVar10)) goto LAB_01378b73;
              }
            }
          }
        }
      }
      lVar7 = *(long *)((long)t + 0xe0);
      lVar9 = *(long *)((long)t + 0xe8);
    } while (lVar7 < lVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Matrix assembled\n",0x11);
  std::ostream::flush();
  return (void *)0x0;
}

Assistant:

void *TPZParFrontStructMatrix<TFront,TVar,TPar>::GlobalAssemble(void *t){
    
	TPZParFrontStructMatrix<TFront,TVar,TPar> *parfront = (TPZParFrontStructMatrix<TFront,TVar,TPar> *) t;
	TPZAdmChunkVector<TPZCompEl *> &elementvec = parfront->fMesh->ElementVec();
	while(parfront->fCurrentAssembled < parfront->fNElements) {
		
#ifndef USING_ATLAS
        const int unit = (parfront->fNElements/200 == 0 ? 1 : parfront->fNElements/200);
        if(!(parfront->fCurrentAssembled%unit))std::cout << "*";
		std::cout.flush();
		if(!(parfront->fCurrentAssembled%(20*unit)) && parfront->fCurrentAssembled)
        {
			if(parfront->fCurrentElement!=parfront->fNElements){
				std::cout << " Element " << parfront->fCurrentElement << " " << (100*parfront->fCurrentElement/parfront->fNElements) << "% Elements computed " << (100*parfront->fCurrentAssembled/parfront->fNElements) << "% Elements assembled " << std::endl;
				std::cout.flush();
			}else{
				std::cout << " " << (100*parfront->fCurrentAssembled/parfront->fNElements) << "% Elements assembled " << std::endl;
				std::cout.flush();
			}
		}
#endif
		/**
		 *Lock mutex and search for an available element
		 *A global variable to be updated whenever a element is processed
		 */
		
		//Lock a mutex and get an element number
		int64_t local_element = parfront->fCurrentAssembled;
		parfront->fCurrentAssembled++;
		
		if(parfront->fElementOrder[local_element] < 0) continue;
		TPZCompEl *el = elementvec[parfront->fElementOrder[local_element]];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(parfront->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else 
		{
			TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *> (el);
            TPZElementGroup *elgrp = dynamic_cast<TPZElementGroup *>(el);
            TPZCondensedCompEl *condel = dynamic_cast<TPZCondensedCompEl *>(el);
			if(!submesh && ! elgrp && ! condel)
			{
				continue;
			}
		}
		
		//Searches for next element
		int64_t i=0;
		int64_t aux = -1;
		TPZElementMatrix *ekaux = 0, *efaux = 0;
        {
            std::unique_lock<std::mutex> global_lock(mutex_global_assemble);
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Acquired mutex_global_assemble";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            while(aux != local_element){
                while(i < parfront->felnum.NElements()) {
                    if(parfront->felnum[i] == local_element){
                        TPZElementMatrix *ektemp, *eftemp;
                        aux = parfront->felnum[i];
                        ekaux = parfront->fekstack[i];
                        efaux = parfront->fefstack[i];
                        int64_t itemp = parfront->felnum.Pop();
                        ektemp = parfront->fekstack.Pop();
                        eftemp = parfront->fefstack.Pop();
                        if(parfront->felnum.NElements()<parfront->fMaxStackSize){
                            stackfull.notify_all();
                        }
                        if(i < parfront->felnum.NElements()) {
                            
                            parfront->felnum[i] = itemp;
                            parfront->fekstack[i]=ektemp;
                            parfront->fefstack[i]=eftemp;
                        }
                        break;
                    }
                    i++;
                }
                if(aux!=local_element){
                    i=0;
    #ifdef PZ_LOG
                    if (logger.isDebugEnabled())
                    {
                        std::stringstream sout;
                        sout << "Waiting on condassemble";
                        LOGPZ_DEBUG(logger,sout.str())
                    }
    #endif
                    condassemble.wait(global_lock);
                }
            }
    #ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Unlocking mutex_global_assemble";
                LOGPZ_DEBUG(logger,sout.str())
            }
    #endif
            // global_lock is being destroyed...
        }
		parfront->AssembleElement(el, *ekaux, *efaux, *parfront->fStiffness, *parfront->fRhs);
		if(parfront->fCurrentAssembled == parfront->fNElements)
		{
#ifdef STACKSTORAGE
            TPZParFrontMatrix<TVar,TPZStackEqnStorage<TVar>, TFront> *mat = dynamic_cast< TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front>* > (parfront->fStiffness);
#else
            TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (parfront->fStiffness);
            
#endif
			mat->FinishWriting();
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "fFinishedComputing set to 1";
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
		}
		
		delete ekaux;
		delete efaux;
		
		if(parfront->fGuiInterface) if(parfront->fGuiInterface->AmIKilled()){
#ifdef STACKSTORAGE
			TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front>* > (parfront->fStiffness);
#else
            TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (parfront->fStiffness);
            
#endif
			mat->FinishWriting();
			break;
		}
		
		
	}//fim for iel
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Terminating assemble thread";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << "Matrix assembled\n";
	std::cout.flush();

	return 0;
}